

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O2

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* parse_script_arg(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *__return_storage_ptr__,string *arg,string *fname,string *err)

{
  size_type sVar1;
  undefined1 auVar2 [8];
  pointer pbVar3;
  char cVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  istream *piVar8;
  bool bVar9;
  undefined8 uVar10;
  pointer pcVar11;
  string *psVar12;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  string *psVar13;
  ulong uVar14;
  int i_1;
  int i_2;
  size_type sVar15;
  bool bVar16;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Da_01;
  undefined4 extraout_XMM0_Da_02;
  undefined4 extraout_XMM0_Da_03;
  undefined4 extraout_XMM0_Da_04;
  undefined4 extraout_XMM0_Da_05;
  undefined4 extraout_XMM0_Da_06;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Db_02;
  undefined4 extraout_XMM0_Db_03;
  undefined4 extraout_XMM0_Db_04;
  undefined4 extraout_XMM0_Db_05;
  undefined4 extraout_XMM0_Db_06;
  string local_528;
  string local_508;
  undefined1 local_4e8 [8];
  string val;
  string local_2e0;
  string local_2c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_280;
  string local_260;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_240;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_220;
  string local_200;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  string local_140;
  ulong local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  undefined1 auStack_f8 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  arr;
  undefined1 local_d0 [8];
  string line;
  undefined1 local_a8 [8];
  string index;
  string def;
  string element;
  
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  if (*(arg->_M_dataplus)._M_p == '\"') {
    readQuote((string *)local_4e8,arg);
    if (val._M_dataplus._M_p != (pointer)0x0) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(__return_storage_ptr__,(value_type *)local_4e8);
    }
    psVar13 = (string *)local_4e8;
    goto LAB_00124a5a;
  }
  lVar7 = std::__cxx11::string::find((char *)arg,0x12b4dd);
  if (lVar7 != -1) {
    iVar5 = std::__cxx11::string::find((char *)arg,0x12b4dd);
    iVar6 = std::__cxx11::string::find((char *)arg,0x12bb5c);
    std::__cxx11::string::substr((ulong)&local_2c0,(ulong)arg);
    trimSpaces((string *)local_a8,&local_2c0);
    std::__cxx11::string::~string((string *)&local_2c0);
    if ((iVar5 + 1 == iVar6) || (index._M_dataplus._M_p == (pointer)0x0)) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&index.field_2 + 8),err,
                     "\t Reason: array index couldn\'t be parsed from \'");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4e8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&index.field_2 + 8),arg);
      std::operator+(&local_2a0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4e8,
                     "\'\n");
      log((double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da));
      std::__cxx11::string::~string((string *)&local_2a0);
      std::__cxx11::string::~string((string *)local_4e8);
      std::__cxx11::string::~string((string *)(index.field_2._M_local_buf + 8));
      bVar9 = true;
      bVar16 = false;
    }
    else {
      bVar9 = true;
      for (pcVar11 = (pointer)0x0; index._M_dataplus._M_p != pcVar11; pcVar11 = pcVar11 + 1) {
        bVar9 = (bool)(bVar9 & (int)*(char *)((long)local_a8 + (long)pcVar11) - 0x30U < 10);
      }
      if (bVar9) {
        iVar5 = atoi((char *)local_a8);
        uVar14 = (ulong)iVar5;
      }
      else {
        uVar14 = 0xffffffffffffffff;
      }
      std::__cxx11::string::find((char *)arg,0x12b4dd);
      std::__cxx11::string::substr((ulong)((long)&index.field_2 + 8),(ulong)arg);
      auStack_f8 = (undefined1  [8])0x0;
      arr.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      arr.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      std::ifstream::ifstream(local_4e8,(string *)fname,_S_in);
      cVar4 = std::__basic_file<char>::is_open();
      if (cVar4 != '\0') {
        local_d0 = (undefined1  [8])&line._M_string_length;
        line._M_dataplus._M_p = (pointer)0x0;
        line._M_string_length._0_1_ = 0;
        line.field_2._8_8_ = 0;
        local_120 = uVar14;
LAB_0012508d:
        do {
          do {
            psVar12 = (string *)(&def.field_2._M_allocated_capacity + 1);
            piVar8 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                               ((istream *)local_4e8,(string *)local_d0);
            if (((byte)piVar8[*(long *)(*(long *)piVar8 + -0x18) + 0x20] & 5) != 0)
            goto LAB_00125345;
            std::__cxx11::string::string((string *)&local_528,(string *)local_d0);
            trimSpaces(psVar12,&local_528);
            std::__cxx11::string::operator=((string *)local_d0,(string *)psVar12);
            std::__cxx11::string::~string((string *)psVar12);
            std::__cxx11::string::~string((string *)&local_528);
            lVar7 = std::__cxx11::string::find((char *)local_d0,0x12b2c2);
          } while (lVar7 == 0);
          if ((line.field_2._8_8_ & 1) == 0) {
            lVar7 = std::__cxx11::string::find((string *)local_d0,(ulong)((long)&index.field_2 + 8))
            ;
            if (lVar7 == -1) goto LAB_0012508d;
            std::__cxx11::string::find((string *)local_d0,(ulong)((long)&index.field_2 + 8));
            std::__cxx11::string::substr((ulong)psVar12,(ulong)local_d0);
            std::__cxx11::string::operator=((string *)local_d0,(string *)psVar12);
            std::__cxx11::string::~string((string *)psVar12);
            lVar7 = std::__cxx11::string::find((char *)local_d0,0x12c72b);
            if (lVar7 == -1) goto LAB_0012508d;
            std::__cxx11::string::find((char *)local_d0,0x12c72b);
            uVar10 = 0xffffffffffffffff;
            std::__cxx11::string::substr((ulong)psVar12,(ulong)local_d0);
            std::__cxx11::string::operator=((string *)local_d0,(string *)psVar12);
            std::__cxx11::string::~string((string *)psVar12);
            lVar7 = std::__cxx11::string::find((char *)local_d0,0x12c32a);
            line.field_2._8_8_ = CONCAT71((int7)((ulong)uVar10 >> 8),1);
            if (lVar7 == -1) {
              std::__cxx11::string::find((char *)local_d0,0x12c32a);
              std::__cxx11::string::substr((ulong)psVar12,(ulong)local_d0);
              std::__cxx11::string::operator=((string *)local_d0,(string *)psVar12);
              std::__cxx11::string::~string((string *)psVar12);
            }
          }
          lVar7 = std::__cxx11::string::find((char *)local_d0,0x12c32a);
          if (lVar7 != -1) goto LAB_00125243;
          std::__cxx11::string::find((char *)local_d0,0x12c32a);
          std::__cxx11::string::substr((ulong)psVar12,(ulong)local_d0);
          std::__cxx11::string::operator=((string *)local_d0,(string *)psVar12);
          while( true ) {
            std::__cxx11::string::~string((string *)(def.field_2._M_local_buf + 8));
LAB_00125243:
            readQuote((string *)(def.field_2._M_local_buf + 8),(string *)local_d0);
            if (element._M_dataplus._M_p == (pointer)0x0) break;
            std::__cxx11::string::find((char *)local_d0,0x12b972);
            std::__cxx11::string::substr((ulong)&local_118,(ulong)local_d0);
            std::__cxx11::string::operator=((string *)local_d0,(string *)&local_118);
            std::__cxx11::string::~string((string *)&local_118);
            std::__cxx11::string::find((char *)local_d0,0x12b972);
            std::__cxx11::string::substr((ulong)&local_118,(ulong)local_d0);
            std::__cxx11::string::operator=((string *)local_d0,(string *)&local_118);
            std::__cxx11::string::~string((string *)&local_118);
            std::__cxx11::string::find((char *)local_d0,0x12c6d0);
            std::__cxx11::string::substr((ulong)&local_118,(ulong)local_d0);
            std::__cxx11::string::operator=((string *)local_d0,(string *)&local_118);
            std::__cxx11::string::~string((string *)&local_118);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)auStack_f8,(value_type *)((long)&def.field_2 + 8));
          }
          std::__cxx11::string::~string((string *)(def.field_2._M_local_buf + 8));
          lVar7 = std::__cxx11::string::find((char *)local_d0,0x12c179);
        } while (lVar7 == -1);
LAB_00125345:
        std::__cxx11::string::~string((string *)local_d0);
        uVar14 = local_120;
      }
      std::ifstream::close();
      pbVar3 = arr.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      auVar2 = auStack_f8;
      lVar7 = (long)arr.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start - (long)auStack_f8;
      bVar9 = lVar7 != 0;
      if (lVar7 == 0) {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&def.field_2 + 8),err,
                       "\t Reason: Failed to parse array definition for \'");
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d0
                       ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        ((long)&def.field_2 + 8),arg);
        std::operator+(&local_280,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d0
                       ,"\n");
        log((double)CONCAT44(extraout_XMM0_Db_03,extraout_XMM0_Da_03));
        std::__cxx11::string::~string((string *)&local_280);
        std::__cxx11::string::~string((string *)local_d0);
        std::__cxx11::string::~string((string *)(def.field_2._M_local_buf + 8));
      }
      else if (uVar14 < (ulong)(lVar7 >> 5)) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(__return_storage_ptr__,(value_type *)((long)auStack_f8 + uVar14 * 0x20));
      }
      else {
        lVar7 = 0;
        for (uVar14 = 0;
            uVar14 < (ulong)((long)arr.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start - (long)auStack_f8 >> 5
                            ); uVar14 = uVar14 + 1) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(__return_storage_ptr__,(value_type *)((long)auStack_f8 + lVar7));
          lVar7 = lVar7 + 0x20;
        }
      }
      bVar16 = (undefined1  [8])pbVar3 == auVar2;
      std::ifstream::~ifstream(local_4e8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)auStack_f8);
      std::__cxx11::string::~string((string *)(index.field_2._M_local_buf + 8));
    }
    std::__cxx11::string::~string((string *)local_a8);
    goto LAB_001256b3;
  }
  lVar7 = std::__cxx11::string::find((char *)arg,0x12c137);
  if ((lVar7 == -1) || (lVar7 = std::__cxx11::string::find((char *)arg,0x12be16), lVar7 == -1)) {
    sVar1 = arg->_M_string_length;
    sVar15 = 0;
    do {
      if (sVar1 == sVar15) {
        lVar7 = std::__cxx11::string::find((char *)arg,0x12c854);
        if (lVar7 != -1) {
          std::__cxx11::string::find((char *)arg,0x12c854);
          std::__cxx11::string::substr((ulong)local_4e8,(ulong)arg);
          std::__cxx11::string::operator=((string *)arg,(string *)local_4e8);
          std::__cxx11::string::~string((string *)local_4e8);
        }
        std::ifstream::ifstream(local_4e8,(string *)fname,_S_in);
        cVar4 = std::__basic_file<char>::is_open();
        if (cVar4 == '\0') goto LAB_00125722;
        local_a8 = (undefined1  [8])&index._M_string_length;
        index._M_dataplus._M_p = (pointer)0x0;
        index._M_string_length._0_1_ = 0;
        psVar12 = (string *)(&index.field_2._M_allocated_capacity + 1);
        goto LAB_00124e2a;
      }
      cVar4 = (arg->_M_dataplus)._M_p[sVar15];
      iVar6 = (int)cVar4;
      iVar5 = isalpha(iVar6);
      sVar15 = sVar15 + 1;
    } while ((((iVar6 == 0x3a) || (cVar4 == '_')) || (iVar5 != 0)) || (iVar6 - 0x30U < 10));
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8,err
                   ,"\t Reason: argument \'");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4e8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8,arg
                  );
    std::operator+(&local_1a0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4e8,
                   "\' does not appear to be a string, variable, or function\n");
    log((double)CONCAT44(extraout_XMM0_Db_01,extraout_XMM0_Da_01));
    std::__cxx11::string::~string((string *)&local_1a0);
    psVar13 = (string *)local_4e8;
  }
  else {
    iVar5 = std::__cxx11::string::find((char *)arg,0x12c137);
    iVar6 = std::__cxx11::string::find((char *)arg,0x12be16);
    std::__cxx11::string::substr((ulong)&local_260,(ulong)arg);
    trimSpaces((string *)local_a8,&local_260);
    std::__cxx11::string::~string((string *)&local_260);
    if ((iVar5 + 1 == iVar6) || (index._M_dataplus._M_p == (pointer)0x0)) {
      std::__cxx11::string::find((char *)arg,0x12c137);
      std::__cxx11::string::substr((ulong)local_4e8,(ulong)arg);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&index.field_2 + 8),"string ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4e8)
      ;
      std::__cxx11::string::~string((string *)local_4e8);
      std::ifstream::ifstream(local_4e8,(string *)fname,_S_in);
      cVar4 = std::__basic_file<char>::is_open();
      if (cVar4 != '\0') {
        local_d0 = (undefined1  [8])&line._M_string_length;
        line._M_dataplus._M_p = (pointer)0x0;
        line._M_string_length._0_1_ = 0;
        iVar5 = 0;
        psVar12 = (string *)(def.field_2._M_local_buf + 8);
        line.field_2._8_8_ = 0;
        do {
          do {
            piVar8 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                               ((istream *)local_4e8,(string *)local_d0);
            bVar16 = true;
            if (((byte)piVar8[*(long *)(*(long *)piVar8 + -0x18) + 0x20] & 5) != 0)
            goto LAB_00125933;
            std::__cxx11::string::string((string *)&local_508,(string *)local_d0);
            trimSpaces(psVar12,&local_508);
            std::__cxx11::string::operator=((string *)local_d0,(string *)psVar12);
            std::__cxx11::string::~string((string *)psVar12);
            std::__cxx11::string::~string((string *)&local_508);
            lVar7 = std::__cxx11::string::find((char *)local_d0,0x12b2c2);
            iVar5 = iVar5 + 1;
          } while (lVar7 == 0);
          lVar7 = std::__cxx11::string::find((string *)local_d0,(ulong)((long)&index.field_2 + 8));
          uVar10 = CONCAT71((int7)((ulong)line.field_2._8_8_ >> 8),
                            (byte)line.field_2._8_8_ | lVar7 != -1);
          uVar14 = line.field_2._8_8_ & 1;
          line.field_2._8_8_ = uVar10;
        } while ((uVar14 == 0 && lVar7 == -1) ||
                (iVar6 = std::__cxx11::string::find((char *)local_d0,0x12c792), iVar6 == -1));
        std::__cxx11::string::substr((ulong)((long)&def.field_2 + 8),(ulong)local_d0);
        psVar13 = (string *)(def.field_2._M_local_buf + 8);
        std::__cxx11::string::operator=((string *)local_d0,psVar13);
        std::__cxx11::string::~string(psVar13);
        iVar6 = std::__cxx11::string::find((char *)local_d0,0x12c179);
        if (iVar6 == -1) {
          std::operator+(&local_160,err,"\t Reason: Failed to parse return value for \'");
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         auStack_f8,&local_160,arg);
          std::operator+(&local_118,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         auStack_f8,"\' on line ");
          std::__cxx11::to_string(&local_140,iVar5);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&def.field_2 + 8),&local_118,&local_140);
          std::operator+(&local_220,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&def.field_2 + 8),"\n");
          log((double)CONCAT44(extraout_XMM0_Db_02,extraout_XMM0_Da_02));
          this = &local_220;
LAB_001258f5:
          std::__cxx11::string::~string((string *)this);
          std::__cxx11::string::~string((string *)(def.field_2._M_local_buf + 8));
          std::__cxx11::string::~string((string *)&local_140);
          std::__cxx11::string::~string((string *)&local_118);
          std::__cxx11::string::~string((string *)auStack_f8);
          std::__cxx11::string::~string((string *)&local_160);
LAB_00125933:
          bVar9 = false;
        }
        else {
          std::__cxx11::string::substr((ulong)&local_200,(ulong)local_d0);
          trimSpaces((string *)((long)&def.field_2 + 8),&local_200);
          std::__cxx11::string::operator=((string *)local_d0,psVar13);
          std::__cxx11::string::~string(psVar13);
          std::__cxx11::string::~string((string *)&local_200);
          lVar7 = std::__cxx11::string::find((char *)local_d0,0x12b972);
          if (lVar7 == -1) {
            std::operator+(&local_160,err,"\t Reason: Failed to parse return value for \'");
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           auStack_f8,&local_160,arg);
            std::operator+(&local_118,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           auStack_f8,"\' on line ");
            std::__cxx11::to_string(&local_140,iVar5);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           ((long)&def.field_2 + 8),&local_118,&local_140);
            std::operator+(&local_1e0,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           ((long)&def.field_2 + 8),"\n");
            log((double)CONCAT44(extraout_XMM0_Db_05,extraout_XMM0_Da_05));
            this = &local_1e0;
            goto LAB_001258f5;
          }
          std::ifstream::close();
          readQuote((string *)((long)&def.field_2 + 8),(string *)local_d0);
          if (element._M_dataplus._M_p != (pointer)0x0) {
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(__return_storage_ptr__,(value_type *)((long)&def.field_2 + 8));
          }
          std::__cxx11::string::~string((string *)(def.field_2._M_local_buf + 8));
          bVar9 = true;
          bVar16 = false;
        }
        std::__cxx11::string::~string((string *)local_d0);
        if (!bVar16) {
          std::ifstream::~ifstream(local_4e8);
          std::__cxx11::string::~string((string *)(index.field_2._M_local_buf + 8));
          std::__cxx11::string::~string((string *)local_a8);
LAB_001256b8:
          if (bVar9) {
            return __return_storage_ptr__;
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(__return_storage_ptr__);
          return __return_storage_ptr__;
        }
      }
      std::ifstream::close();
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&def.field_2 + 8),err,
                     "\t Reason: Failed to parse function definition for \'");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&def.field_2 + 8),arg);
      std::operator+(&local_1c0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d0,
                     "\n");
      log((double)CONCAT44(extraout_XMM0_Db_06,extraout_XMM0_Da_06));
      std::__cxx11::string::~string((string *)&local_1c0);
      std::__cxx11::string::~string((string *)local_d0);
      std::__cxx11::string::~string((string *)(def.field_2._M_local_buf + 8));
      std::ifstream::~ifstream(local_4e8);
    }
    else {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&index.field_2 + 8),err,"\t Reason: function call \'");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4e8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&index.field_2 + 8),arg);
      std::operator+(&local_240,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4e8,
                     "\' has parameters\n");
      log((double)CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00));
      std::__cxx11::string::~string((string *)&local_240);
      std::__cxx11::string::~string((string *)local_4e8);
    }
    psVar13 = (string *)(index.field_2._M_local_buf + 8);
  }
  std::__cxx11::string::~string(psVar13);
  psVar13 = (string *)local_a8;
LAB_00124a5a:
  std::__cxx11::string::~string(psVar13);
  return __return_storage_ptr__;
LAB_00124e2a:
  do {
    piVar8 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)local_4e8,(string *)local_a8);
    if (((byte)piVar8[*(long *)(*(long *)piVar8 + -0x18) + 0x20] & 5) != 0) {
      std::__cxx11::string::~string((string *)local_a8);
LAB_00125722:
      std::ifstream::close();
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&index.field_2 + 8),err,
                     "\t Reason: Failed to parse variable assignment for \'");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&index.field_2 + 8),arg);
      std::operator+(&local_180,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8,
                     "\n");
      log((double)CONCAT44(extraout_XMM0_Db_04,extraout_XMM0_Da_04));
      std::__cxx11::string::~string((string *)&local_180);
      std::__cxx11::string::~string((string *)local_a8);
      std::__cxx11::string::~string((string *)(index.field_2._M_local_buf + 8));
      bVar16 = true;
      bVar9 = false;
      goto LAB_001257a5;
    }
    std::__cxx11::string::string((string *)&local_2e0,(string *)local_a8);
    trimSpaces(psVar12,&local_2e0);
    std::__cxx11::string::operator=((string *)local_a8,(string *)psVar12);
    std::__cxx11::string::~string((string *)psVar12);
    std::__cxx11::string::~string((string *)&local_2e0);
    lVar7 = std::__cxx11::string::find((char *)local_a8,0x12b2c2);
    if ((lVar7 != 0) &&
       (lVar7 = std::__cxx11::string::find((string *)local_a8,(ulong)arg), lVar7 != -1)) {
      std::__cxx11::string::find((string *)local_a8,(ulong)arg);
      std::__cxx11::string::substr((ulong)psVar12,(ulong)local_a8);
      std::__cxx11::string::operator=((string *)local_a8,(string *)psVar12);
      std::__cxx11::string::~string((string *)psVar12);
      lVar7 = std::__cxx11::string::find((char *)local_a8,0x12c72b);
      if (lVar7 != -1) {
        std::__cxx11::string::find((char *)local_a8,0x12c72b);
        std::__cxx11::string::substr((ulong)psVar12,(ulong)local_a8);
        std::__cxx11::string::operator=((string *)local_a8,(string *)psVar12);
        std::__cxx11::string::~string((string *)psVar12);
        lVar7 = std::__cxx11::string::find((char *)local_a8,0x12c179);
        if (lVar7 != -1) break;
      }
    }
  } while( true );
  std::__cxx11::string::find((char *)local_a8,0x12c179);
  std::__cxx11::string::substr((ulong)psVar12,(ulong)local_a8);
  std::__cxx11::string::operator=((string *)local_a8,(string *)psVar12);
  std::__cxx11::string::~string((string *)psVar12);
  lVar7 = std::__cxx11::string::find((char *)local_a8,0x12b972);
  if (lVar7 != -1) goto LAB_00124fa5;
  goto LAB_00124e2a;
LAB_00124fa5:
  std::ifstream::close();
  readQuote((string *)((long)&index.field_2 + 8),(string *)local_a8);
  if (def._M_dataplus._M_p != (pointer)0x0) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(__return_storage_ptr__,(value_type *)((long)&index.field_2 + 8));
  }
  std::__cxx11::string::~string((string *)(index.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)local_a8);
  bVar9 = true;
  bVar16 = false;
LAB_001257a5:
  std::ifstream::~ifstream(local_4e8);
LAB_001256b3:
  if (bVar16) {
    return __return_storage_ptr__;
  }
  goto LAB_001256b8;
}

Assistant:

vector<string> parse_script_arg(string arg, string fname, string err)
{
	vector<string> ret;

	// parse weapon name from argument 1
	if (arg[0] == '"')
	{
		// It's a string. Easy!
		string val = readQuote(arg);
		if (val.length())
			ret.push_back(val);
		return ret;
	}
	else if (arg.find("[") != string::npos)
	{
		// an index into an array
		int open = arg.find("[");
		int close = arg.find("]");
		string index = trimSpaces(arg.substr(open, close));
		if (close == open+1 || index.length() == 0)
		{
			log(err + "\t Reason: array index couldn't be parsed from '" + arg + "'\n");
			return ret;
		}
		
		bool isNumber = true;
		int idx = -1;
		for (int i = 0; i < index.size(); i++)
			if (!isdigit(index[i]))
				isNumber = false;
		if (isNumber)
			idx = atoi(index.c_str());
		
		// Parse file for array definition
		string def = arg.substr(0, arg.find("["));
		vector<string> arr;
		ifstream file(fname);
		if (file.is_open())
		{
			int lineNum = 0;
			bool in_array = false;
			string line;
			while (getline(file, line))
			{
				lineNum++;

				line = trimSpaces(line);
				if (line.find("//") == 0)
					continue;

				if (!in_array)
				{
					if (line.find(def) == string::npos)
						continue;
					line = line.substr(line.find(def) + def.length());

					if (line.find("=") == string::npos)
						continue;
					line = line.substr(line.find("=") + 1);

					if (line.find("{") == string::npos)
						line = line.substr(line.find("{") + 1);

					in_array = true;
				}
				if (in_array)
				{
					if (line.find("{") == string::npos)
						line = line.substr(line.find("{") + 1);

					bool hasQuote = true;
					while(hasQuote)
					{
						string element = readQuote(line);
						if (element.length())
						{
							line = line.substr(line.find("\"") + 1);
							line = line.substr(line.find("\"") + 1);
							line = line.substr(line.find(",") + 1);
							arr.push_back(element);
						}
						else
							break;
					}

					if (line.find(";") != string::npos)
						break;
				}
				
			}
		}
		file.close();

		if (arr.size() > 0)
		{
			if (idx >= arr.size())
			{
				for (int i = 0; i < arr.size(); i++)
					ret.push_back(arr[i]);
				return ret;
			}
			else
			{
				ret.push_back(arr[idx]);
				return ret;
			}
		}

		log(err + "\t Reason: Failed to parse array definition for '" + arg + "\n");
	}
	else if (arg.find("(") != string::npos && arg.find(")") != string::npos)
	{
		// Uh oh. It's a function
		int open = arg.find("(");
		int close = arg.find(")");
		string params = trimSpaces(arg.substr(open, close));
		if (close != open+1 && params.length())
		{
			log(err + "\t Reason: function call '" + arg + "' has parameters\n");
			return ret;
		}
					
		string funcdef = "string " + arg.substr(0, arg.find("(") + 1);

		// Parse file for function definition
		// anything more complicated than { return "weapon_super"; } won't work
		ifstream file(fname);
		if (file.is_open())
		{
			int lineNum = 0;
			bool in_func_body = false;
			string line;
			while (getline(file, line))
			{
				lineNum++;

				line = trimSpaces(line);
				if (line.find("//") == 0)
					continue;

				if (line.find(funcdef) != string::npos)
					in_func_body = true;

				if (in_func_body)
				{
					int iret = line.find("return ");
					if (iret != string::npos)
					{
						line = line.substr(iret);
						int semi = line.find(";");
						if (semi == string::npos)
						{
							log(err + "\t Reason: Failed to parse return value for '" + arg + "' on line " + to_string(lineNum) + "\n");
							break;
						}
						line = trimSpaces(line.substr(0, semi));
						if (line.find("\"") == string::npos)
						{
							log(err + "\t Reason: Failed to parse return value for '" + arg + "' on line " + to_string(lineNum) + "\n");
							break;
						}
						file.close();

						string val = readQuote(line);
						if (val.length())
							ret.push_back(val);
						return ret;
					}
				}
			}
		}
		file.close();
		log(err + "\t Reason: Failed to parse function definition for '" + arg + "\n");
		return ret;
	}
	else // must be a variable
	{
		bool valid_var_name = true;
		for (int i = 0; i < arg.length(); i++)
		{
			if (!isalpha(arg[i]) && !isdigit(arg[i]) && arg[i] != '_' && arg[i] != ':')
			{
				valid_var_name = false;
				break;
			}
		}
		if (!valid_var_name)
		{
			log(err + "\t Reason: argument '" + arg + "' does not appear to be a string, variable, or function\n");
			return ret;
		}
		
		// Strip namespace from the variable name.
		// This will break if there's a different var with the same name assigned in the same file.
		// Ideally all scripts should be searched and the namespace should only be removed when
		// inside the namespace block. Anyway this is good enough for ressya_no_tabi.
		if (arg.find("::") != string::npos) {
			arg = arg.substr(arg.find("::")+2);
		}

		// Parse file for variable assignment
		// ...hopefully it's a global assigned at the top of the file
		ifstream file(fname);
		if (file.is_open())
		{
			int lineNum = 0;
			string line;
			while (getline(file, line))
			{
				lineNum++;

				line = trimSpaces(line);
				if (line.find("//") == 0)
					continue;

				if (line.find(arg) == string::npos)
					continue;
				line = line.substr(line.find(arg) + arg.length());

				if (line.find("=") == string::npos)
					continue;
				line = line.substr(line.find("=") + 1);

				if (line.find(";") == string::npos)
					continue;
				line = line.substr(0, line.find(";"));

				if (line.find("\"") == string::npos)
					continue;

				file.close();

				string val = readQuote(line);
				if (val.length())
					ret.push_back(val);
				return ret;
			}
		}
		file.close();
		log(err + "\t Reason: Failed to parse variable assignment for '" + arg + "\n");
	}

	return ret;
}